

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
::swap_rows(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
            *this,ID_index rowIndex1,ID_index rowIndex2)

{
  mapped_type mVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  mapped_type *__b;
  pointer ppVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar6;
  bool local_79;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  undefined1 local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  iterator it2;
  iterator it1;
  ID_index rowIndex2_local;
  ID_index rowIndex1_local;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
  *this_local;
  
  this->rowSwapped_ = true;
  it1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._0_4_ =
       rowIndex2;
  it1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       rowIndex1;
  it2 = std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::find(&this->indexToRow_,
               (key_type *)
               ((long)&it1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->indexToRow_,(key_type *)&it1);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->indexToRow_);
  bVar2 = std::__detail::operator==
                    (&it2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>,
                     &local_30);
  local_79 = false;
  if (bVar2) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->indexToRow_);
    local_79 = std::__detail::operator==(&local_28,&local_38);
  }
  if (local_79 == false) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->indexToRow_);
    bVar2 = std::__detail::operator==
                      (&it2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ,&local_40);
    if (bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_28);
      pVar6 = std::
              unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              ::emplace<unsigned_int&,unsigned_int&>
                        ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                          *)this,(uint *)((long)&it1.
                                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                 ._M_cur + 4),&ppVar3->second);
      mVar1 = it1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur._4_4_;
      local_50._M_cur =
           (__node_type *)
           pVar6.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
           ._M_cur;
      local_48 = pVar6.second;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_28);
      pmVar4 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::at(&this->rowToIndex_,&ppVar3->second);
      *pmVar4 = mVar1;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_28);
      std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::erase(&this->indexToRow_,&ppVar3->second);
    }
    else {
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->indexToRow_);
      bVar2 = std::__detail::operator==(&local_28,&local_58);
      if (bVar2) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->(&it2);
        std::
        unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::emplace<unsigned_int&,unsigned_int&>
                  ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    *)this,(uint *)&it1,&ppVar3->second);
        mVar1 = (ID_index)
                it1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->(&it2);
        pmVar4 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::at(&this->rowToIndex_,&ppVar3->second);
        *pmVar4 = mVar1;
        std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::erase(&this->indexToRow_,it2);
      }
      else {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->(&it2);
        pmVar4 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::at(&this->rowToIndex_,&ppVar3->second);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_28);
        __b = std::
              unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::at(&this->rowToIndex_,&ppVar3->second);
        std::swap<unsigned_int>(pmVar4,__b);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->(&it2);
        ppVar5 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_28);
        std::swap<unsigned_int>(&ppVar3->second,&ppVar5->second);
      }
    }
  }
  return;
}

Assistant:

inline void Base_swap<Master_matrix, Base_matrix>::swap_rows(ID_index rowIndex1, ID_index rowIndex2)
{
  rowSwapped_ = true;

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto it1 = indexToRow_.find(rowIndex1);
    auto it2 = indexToRow_.find(rowIndex2);

    if (it1 == indexToRow_.end() && it2 == indexToRow_.end()) return;

    if (it1 == indexToRow_.end()) {
      indexToRow_.emplace(rowIndex1, it2->second);
      rowToIndex_.at(it2->second) = rowIndex1;
      indexToRow_.erase(it2->second);
      return;
    }

    if (it2 == indexToRow_.end()) {
      indexToRow_.emplace(rowIndex2, it1->second);
      rowToIndex_.at(it1->second) = rowIndex2;
      indexToRow_.erase(it1);
      return;
    }

    std::swap(rowToIndex_.at(it1->second), rowToIndex_.at(it2->second));
    std::swap(it1->second, it2->second);
  } else {
    for (auto i = indexToRow_.size(); i <= std::max(rowIndex1, rowIndex2); ++i) indexToRow_.push_back(i);

    std::swap(rowToIndex_[indexToRow_[rowIndex1]], rowToIndex_[indexToRow_[rowIndex2]]);
    std::swap(indexToRow_[rowIndex1], indexToRow_[rowIndex2]);
  }
}